

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fverb.cpp
# Opt level: O0

void __thiscall Fverb::process(Fverb *this,float *in0,float *in1,float *out0,float *out1,uint count)

{
  mydsp *this_00;
  float *local_68;
  float *outputs [2];
  float *inputs [2];
  mydsp *dsp;
  uint count_local;
  float *out1_local;
  float *out0_local;
  float *in1_local;
  float *in0_local;
  Fverb *this_local;
  
  this_00 = (mydsp *)std::unique_ptr<Fverb::BasicDsp,_std::default_delete<Fverb::BasicDsp>_>::
                     operator*(&this->fDsp);
  local_68 = out0;
  outputs[0] = out1;
  outputs[1] = in0;
  anon_unknown.dwarf_136bd::mydsp::compute(this_00,count,outputs + 1,&local_68);
  return;
}

Assistant:

void Fverb::process(const float *in0, const float *in1, float *out0,
                    float *out1, unsigned count) noexcept
{

    mydsp &dsp = static_cast<mydsp &>(*fDsp);
    float *inputs[] = {
        const_cast<float *>(in0),
        const_cast<float *>(in1),
    };
    float *outputs[] = {
        out0,
        out1,
    };
    dsp.compute(count, inputs, outputs);
}